

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpxpes_parser.cc
# Opt level: O0

bool __thiscall libwebm::VpxPesParser::ReadPacketLength(VpxPesParser *this,uint16_t *packet_length)

{
  value_type vVar1;
  int iVar2;
  const_reference pvVar3;
  uint16_t *packet_length_local;
  VpxPesParser *this_local;
  
  if ((packet_length != (uint16_t *)0x0) && (iVar2 = BytesAvailable(this), 5 < iVar2)) {
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(this + 0x58),
                        *(long *)(this + 0x70) + 4);
    vVar1 = *pvVar3;
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(this + 0x58),
                        *(long *)(this + 0x70) + 5);
    *packet_length = CONCAT11(vVar1,*pvVar3);
    return true;
  }
  return false;
}

Assistant:

bool VpxPesParser::ReadPacketLength(std::uint16_t* packet_length) const {
  if (!packet_length || BytesAvailable() < 6)
    return false;

  // Read and byte swap 16 bit big endian length.
  *packet_length =
      (pes_file_data_[read_pos_ + 4] << 8) | pes_file_data_[read_pos_ + 5];

  return true;
}